

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printThumbAddrModeRROperand(MCInst *MI,uint Op,SStream *O)

{
  cs_struct *h;
  _Bool _Var1;
  uint uVar2;
  MCOperand *op;
  MCOperand *op_00;
  uint RegNum;
  MCOperand *MO2;
  MCOperand *MO1;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,Op);
  op_00 = MCInst_getOperand(MI,Op + 1);
  _Var1 = MCOperand_isReg(op);
  if (_Var1) {
    SStream_concat0(O,"[");
    set_mem_access(MI,true);
    h = MI->csh;
    uVar2 = MCOperand_getReg(op);
    printRegName(h,O,uVar2);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar2 = MCOperand_getReg(op);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar2;
    }
    uVar2 = MCOperand_getReg(op_00);
    if (uVar2 != 0) {
      SStream_concat0(O,", ");
      printRegName(MI->csh,O,uVar2);
      if (MI->csh->detail != CS_OPT_OFF) {
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x4a) = uVar2;
      }
    }
    SStream_concat0(O,"]");
    set_mem_access(MI,false);
  }
  else {
    printOperand(MI,Op,O);
  }
  return;
}

Assistant:

static void printThumbAddrModeRROperand(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op + 1);
	unsigned RegNum;

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	RegNum = MCOperand_getReg(MO2);
	if (RegNum) {
		SStream_concat0(O, ", ");
		printRegName(MI->csh, O, RegNum);
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = RegNum;
	}
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}